

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLhandler.c
# Opt level: O0

RDL_pathIterator * RDL_pathIteratorNext(RDL_pathIterator *it)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  RDL_lpStackElement *element;
  uchar *puVar4;
  uint *element_00;
  RDL_lpStackElement *top;
  RDL_lpStackElement *new_element;
  uint vertex;
  RDL_pathIterator *it_local;
  
  if (it->end == '\0') {
    iVar2 = RDL_stack_empty(it->stack);
    if (iVar2 != 0) {
      it->end = '\x01';
    }
    while (iVar2 = RDL_stack_empty(it->stack), it_local = it, iVar2 == 0) {
      element = (RDL_lpStackElement *)RDL_stack_top(it->stack);
      if (it->mode == 'a') {
        RDL_bitset_set(it->compressed_path,element->p);
      }
      if (element->r == element->p) {
        RDL_stack_pop(it->stack);
        RDL_lpStackElement_delete(element);
        return it;
      }
      if (it->spi->dPaths[element->r]->degree[element->p] < 2) {
        uVar1 = (*it->spi->dPaths[element->r]->adjList[element->p])[0];
        if (it->mode == 'b') {
          puVar4 = it->compressed_path;
          uVar3 = RDL_edgeId(it->gra,element->p,uVar1);
          RDL_bitset_set(puVar4,uVar3);
        }
        element->p = uVar1;
        element->ai_index = 0;
      }
      else {
        uVar1 = it->spi->dPaths[element->r]->adjList[element->p][element->ai_index][0];
        if (element->ai_index == 0) {
          puVar4 = (uchar *)malloc((ulong)it->compressed_number);
          element->split_copy = puVar4;
          memcpy(element->split_copy,it->compressed_path,(ulong)it->compressed_number);
        }
        else {
          memcpy(it->compressed_path,element->split_copy,(ulong)it->compressed_number);
        }
        if (it->mode == 'b') {
          puVar4 = it->compressed_path;
          uVar3 = RDL_edgeId(it->gra,element->p,uVar1);
          RDL_bitset_set(puVar4,uVar3);
        }
        element_00 = (uint *)malloc(0x18);
        *element_00 = element->r;
        element_00[1] = uVar1;
        element_00[2] = 0;
        element_00[4] = 0;
        element_00[5] = 0;
        element->ai_index = element->ai_index + 1;
        if (it->spi->dPaths[element->r]->degree[element->p] <= element->ai_index) {
          RDL_stack_pop(it->stack);
          RDL_lpStackElement_delete(element);
        }
        RDL_stack_push(it->stack,element_00);
      }
    }
  }
  else {
    (*RDL_outputFunc)(RDL_ERROR,"You tried to next an ended iterator!\n");
    it_local = (RDL_pathIterator *)0x0;
  }
  return it_local;
}

Assistant:

static RDL_pathIterator* RDL_pathIteratorNext(RDL_pathIterator *it)
{
  unsigned vertex;
  RDL_lpStackElement *new_element, *top;

  if (it->end) {
    RDL_outputFunc(RDL_ERROR, "You tried to next an ended iterator!\n");
    return NULL;
  }

  if (RDL_stack_empty(it->stack)) {
    it->end = 1;
  }

  while (!RDL_stack_empty(it->stack)) {
    top = RDL_stack_top(it->stack);

    if(it->mode == 'a') {
      RDL_bitset_set(it->compressed_path, top->p);
    }

    if(top->r == top->p) {
      RDL_stack_pop(it->stack);
      RDL_lpStackElement_delete(top);
      break;
    }

    if(it->spi->dPaths[top->r]->degree[top->p] > 1)/*split*/
    {
      vertex = it->spi->dPaths[top->r]->adjList[top->p][top->ai_index][0];

      if (top->ai_index == 0) {
        top->split_copy = malloc(it->compressed_number * sizeof(*top->split_copy));
        /*make a copy of the path so far*/
        memcpy(top->split_copy, it->compressed_path,
            it->compressed_number * sizeof(*top->split_copy));
      }
      else /*not continuing the last path*/
      {
        /*get the path up until the split*/
        memcpy(it->compressed_path, top->split_copy,
            it->compressed_number * sizeof(*top->split_copy));
      }
      if(it->mode == 'b')
      {
        RDL_bitset_set(it->compressed_path, RDL_edgeId(it->gra,top->p,vertex));
      }

      new_element = malloc(sizeof(*new_element));
      new_element->r = top->r;
      new_element->p = vertex;
      new_element->ai_index = 0;
      new_element->split_copy = NULL;
      ++top->ai_index;
      if (top->ai_index >= it->spi->dPaths[top->r]->degree[top->p]) {
        RDL_stack_pop(it->stack);
        RDL_lpStackElement_delete(top);
      }

      RDL_stack_push(it->stack, new_element);
    }
    else/*not a split*/
    {
      vertex = it->spi->dPaths[top->r]->adjList[top->p][0][0];
      if(it->mode == 'b')
      {
        RDL_bitset_set(it->compressed_path, RDL_edgeId(it->gra,top->p,vertex));
      }
      top->p = vertex;
      top->ai_index = 0;
    }
  }

  return it;
}